

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

uint __thiscall
ON_3dPointListRef::SetFromDoubleArray
          (ON_3dPointListRef *this,size_t point_count,size_t point_stride,double *point_array)

{
  uint uVar1;
  double *point_array_local;
  size_t point_stride_local;
  size_t point_count_local;
  ON_3dPointListRef *this_local;
  
  uVar1 = EmptyPointList.m_point_stride;
  this->m_point_count = EmptyPointList.m_point_count;
  this->m_point_stride = uVar1;
  this->m_dP = EmptyPointList.m_dP;
  this->m_fP = EmptyPointList.m_fP;
  if ((((point_count != 0) && (point_count < 0xffffffff)) && (2 < point_stride)) &&
     ((point_stride < 0xffffffff && (point_array != (double *)0x0)))) {
    this->m_point_count = (uint)point_count;
    this->m_point_stride = (uint)point_stride;
    this->m_dP = point_array;
  }
  return this->m_point_count;
}

Assistant:

unsigned int ON_3dPointListRef::SetFromDoubleArray(
    size_t point_count,
    size_t point_stride,
    const double* point_array
    )
{
  *this = ON_3dPointListRef::EmptyPointList;
  if ( point_count > 0 
       && point_count < (size_t)ON_UNSET_UINT_INDEX 
       && point_stride >= 3
       && point_stride < (size_t)ON_UNSET_UINT_INDEX 
       && 0 != point_array
       )
  {
    m_point_count = (unsigned int)point_count;
    m_point_stride = (unsigned int)point_stride;
    m_dP = point_array;
  }
  return m_point_count;
}